

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O3

void __thiscall wasm::RemoveNonJSOpsPass::doWalkModule(RemoveNonJSOpsPass *this,Module *module)

{
  _List_node_base *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _List_node_base *p_Var4;
  char *pcVar5;
  Builder *pBVar6;
  Module *wasm;
  Function *pFVar7;
  _Rb_tree_node_base *p_Var8;
  Global *pGVar9;
  ulong in_RCX;
  _Hash_node_base *p_Var10;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_R9;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  __node_base *p_Var11;
  pointer puVar12;
  string_view sVar13;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *in_stack_fffffffffffffb08;
  Module intrinsicsModule;
  Result<wasm::Ok> parsed;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> neededFunctions;
  long local_a0 [2];
  char local_90;
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_88;
  __node_base *local_80;
  void *local_78 [2];
  long local_68;
  char local_60;
  _Storage<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false> local_58;
  char local_40;
  _Head_base<0UL,_wasm::Memory_*,_false> local_38;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RCX;
  ABI::wasm2js::ensureHelpers((wasm2js *)module,(Module *)0x0,(IString)(auVar2 << 0x40));
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    pBVar6 = (Builder *)operator_new(8);
    pBVar6->wasm = module;
    (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
    super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = pBVar6;
  }
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,module);
  if ((this->neededIntrinsics)._M_h._M_element_count != 0) {
    Module::Module((Module *)&stack0xfffffffffffffb08);
    p_Var10 = (_Hash_node_base *)IntrinsicsModuleWast;
    wasm = (Module *)strlen(IntrinsicsModuleWast);
    local_90 = '\0';
    sVar13._M_str = (char *)&neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count;
    sVar13._M_len = (size_t)p_Var10;
    WATParser::parseModule
              ((Result<wasm::Ok> *)&intrinsicsModule.tagsMap._M_h._M_single_bucket,
               (WATParser *)&stack0xfffffffffffffb08,wasm,sVar13,in_R9);
    if ((local_90 == '\x01') &&
       (local_90 = '\0',
       (long *)neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count != local_a0)) {
      operator_delete((void *)neededFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      local_a0[0] + 1);
    }
    if (parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      __assert_fail("!parsed.getErr()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveNonJSOps.cpp"
                    ,0x54,"void wasm::RemoveNonJSOpsPass::doWalkModule(Module *)");
    }
    neededFunctions._M_t._M_impl._0_4_ = 0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    puVar12 = intrinsicsModule.functions.
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Rb_tree_node_base *)&neededFunctions;
    neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Rb_tree_node_base *)&neededFunctions;
    if ((this->neededIntrinsics)._M_h._M_element_count != 0) {
      local_88 = &(this->neededIntrinsics)._M_h;
      local_80 = &(this->neededIntrinsics)._M_h._M_before_begin;
      p_Var11 = local_80;
      do {
        while( true ) {
          p_Var11 = p_Var11->_M_nxt;
          if (p_Var11 == (__node_base *)0x0) break;
          p_Var10 = *(_Hash_node_base **)
                     &((_Prime_rehash_policy *)(p_Var11 + 2))->_M_max_load_factor;
          addNeededFunctions(this,(Module *)&stack0xfffffffffffffb08,
                             (Name)*(string_view *)(p_Var11 + 1),
                             (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                             ((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        std::
        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(local_88);
        for (p_Var8 = neededFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var8 != (_Rb_tree_node_base *)&neededFunctions;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          pFVar7 = Module::getFunctionOrNull(module,(Name)*(string_view *)(p_Var8 + 1));
          if (pFVar7 == (Function *)0x0) {
            pFVar7 = Module::getFunction((Module *)&stack0xfffffffffffffb08,
                                         (Name)*(string_view *)(p_Var8 + 1));
            local_60 = '\0';
            local_40 = '\0';
            p_Var10 = (_Hash_node_base *)0x0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_78;
            pFVar7 = wasm::ModuleUtils::copyFunction
                               ((ModuleUtils *)pFVar7,(Function *)module,(Module *)0x0,
                                (Name)(auVar3 << 0x40),
                                (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&local_58._M_value,in_stack_fffffffffffffb08);
            if ((local_40 == '\x01') &&
               (local_40 = '\0',
               local_58._M_value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_58._M_value.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_58._M_value.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_58._0_8_);
            }
            if ((local_60 == '\x01') && (local_60 = '\0', local_78[0] != (void *)0x0)) {
              operator_delete(local_78[0],local_68 - (long)local_78[0]);
            }
          }
          doWalkFunction(this,pFVar7);
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::clear((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        p_Var11 = local_80;
        puVar12 = intrinsicsModule.functions.
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      } while ((this->neededIntrinsics)._M_h._M_element_count != 0);
    }
    for (; puVar12 !=
           (pointer)intrinsicsModule.globals.
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar12 = puVar12 + 1) {
      wasm::ModuleUtils::copyGlobal
                ((Global *)
                 (puVar12->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,module);
    }
    if ((module->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (module->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      sVar13 = IString::interned((IString *)0x1,(string_view)ZEXT816(0xdf9ff1),SUB81(p_Var10,0));
      local_38._M_head_impl = (Memory *)operator_new(0x58);
      ((local_38._M_head_impl)->max).addr = 0;
      *(undefined8 *)&(local_38._M_head_impl)->shared = 0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->initial).addr = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar13;
      ((local_38._M_head_impl)->addressType).id = 2;
      ((local_38._M_head_impl)->max).addr = 1;
      ((local_38._M_head_impl)->initial).addr = 1;
      Module::addMemory(module,(unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                               &local_38);
      if (local_38._M_head_impl != (Memory *)0x0) {
        operator_delete(local_38._M_head_impl,0x58);
      }
    }
    for (p_Var1 = (this->neededImportedGlobals).List.
                  super__List_base<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var1 != (_List_node_base *)&(this->neededImportedGlobals).List; p_Var1 = p_Var1->_M_next)
    {
      pGVar9 = Module::getGlobalOrNull
                         ((this->
                          super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
                          ).
                          super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                          .
                          super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
                          .currModule,(IString)*(IString *)&p_Var1[1]._M_next);
      if (pGVar9 == (Global *)0x0) {
        pGVar9 = (Global *)operator_new(0x50);
        pGVar9->init = (Expression *)0x0;
        *(undefined8 *)&pGVar9->mutable_ = 0;
        (pGVar9->super_Importable).base.super_IString.str._M_str = (char *)0x0;
        (pGVar9->type).id = 0;
        (pGVar9->super_Importable).module.super_IString.str._M_str = (char *)0x0;
        (pGVar9->super_Importable).base.super_IString.str._M_len = 0;
        *(undefined8 *)&(pGVar9->super_Importable).super_Named.hasExplicitName = 0;
        (pGVar9->super_Importable).module.super_IString.str._M_len = 0;
        (pGVar9->super_Importable).super_Named.name.super_IString.str._M_len = 0;
        (pGVar9->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
        p_Var4 = p_Var1[1]._M_prev;
        (pGVar9->super_Importable).super_Named.name.super_IString.str._M_len =
             (size_t)p_Var1[1]._M_next;
        (pGVar9->super_Importable).super_Named.name.super_IString.str._M_str = (char *)p_Var4;
        (pGVar9->type).id = (uintptr_t)p_Var1[2]._M_next;
        pGVar9->mutable_ = false;
        pcVar5 = DAT_010b0e58;
        (pGVar9->super_Importable).module.super_IString.str._M_len = ENV;
        (pGVar9->super_Importable).module.super_IString.str._M_str = pcVar5;
        p_Var4 = p_Var1[1]._M_prev;
        (pGVar9->super_Importable).base.super_IString.str._M_len = (size_t)p_Var1[1]._M_next;
        (pGVar9->super_Importable).base.super_IString.str._M_str = (char *)p_Var4;
        Module::addGlobal(module,pGVar9);
      }
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               &intrinsicsModule.tagsMap._M_h._M_single_bucket);
    Module::~Module((Module *)&stack0xfffffffffffffb08);
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Intrinsics may use scratch memory, ensure it.
    ABI::wasm2js::ensureHelpers(module);

    // Discover all of the intrinsics that we need to inject, lowering all
    // operations to intrinsic calls while we're at it.
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    PostWalker<RemoveNonJSOpsPass>::doWalkModule(module);

    if (neededIntrinsics.size() == 0) {
      return;
    }

    // Parse the wat blob we have at the end of this file.
    //
    // TODO: only do this once per invocation of wasm2asm
    Module intrinsicsModule;
    [[maybe_unused]] auto parsed =
      WATParser::parseModule(intrinsicsModule, IntrinsicsModuleWast);
    assert(!parsed.getErr());

    std::set<Name> neededFunctions;

    // Iteratively link intrinsics from `intrinsicsModule` into our destination
    // module, as needed.
    //
    // Note that intrinsics often use one another. For example the 64-bit
    // division intrinsic ends up using the 32-bit ctz intrinsic, but does so
    // via a native instruction. The loop here is used to continuously reprocess
    // injected intrinsics to ensure that they never contain non-js ops when
    // we're done.
    while (neededIntrinsics.size() > 0) {
      // Recursively probe all needed intrinsics for transitively used
      // functions. This is building up a set of functions we'll link into our
      // module.
      for (auto& name : neededIntrinsics) {
        addNeededFunctions(intrinsicsModule, name, neededFunctions);
      }
      neededIntrinsics.clear();

      // Link in everything that wasn't already linked in. After we've done the
      // copy we then walk the function to rewrite any non-js operations it has
      // as well.
      for (auto& name : neededFunctions) {
        auto* func = module->getFunctionOrNull(name);
        if (!func) {
          func = ModuleUtils::copyFunction(intrinsicsModule.getFunction(name),
                                           *module);
        }
        doWalkFunction(func);
      }
      neededFunctions.clear();
    }

    // Copy all the globals in the intrinsics module
    for (auto& global : intrinsicsModule.globals) {
      ModuleUtils::copyGlobal(global.get(), *module);
    }

    // Intrinsics may use memory, so ensure the module has one.
    MemoryUtils::ensureExists(module);

    // Add missing globals
    for (auto& [name, type] : neededImportedGlobals) {
      if (!getModule()->getGlobalOrNull(name)) {
        auto global = std::make_unique<Global>();
        global->name = name;
        global->type = type;
        global->mutable_ = false;
        global->module = ENV;
        global->base = name;
        module->addGlobal(global.release());
      }
    }
  }